

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O0

void __thiscall DLightFlash::DLightFlash(DLightFlash *this,sector_t *sector)

{
  int iVar1;
  uint uVar2;
  sector_t *sector_local;
  DLightFlash *this_local;
  
  DLighting::DLighting(&this->super_DLighting,sector);
  (this->super_DLighting).super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_009f7998;
  this->m_MaxLight = (int)sector->lightlevel;
  iVar1 = sector_t::FindMinSurroundingLight(sector,(int)sector->lightlevel);
  this->m_MinLight = iVar1;
  this->m_MaxTime = 0x40;
  this->m_MinTime = 7;
  uVar2 = FRandom::operator()(&pr_lightflash);
  this->m_Count = (uVar2 & this->m_MaxTime) + 1;
  return;
}

Assistant:

DLightFlash::DLightFlash (sector_t *sector)
	: DLighting (sector)
{
	// Find light levels like Doom.
	m_MaxLight = sector->lightlevel;
	m_MinLight = sector->FindMinSurroundingLight (sector->lightlevel);
	m_MaxTime = 64;
	m_MinTime = 7;
	m_Count = (pr_lightflash() & m_MaxTime) + 1;
}